

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_go_generator.cc
# Opt level: O0

void __thiscall
t_go_generator::generate_deserialize_container
          (t_go_generator *this,ostream *out,t_type *orig_type,bool pointer_field,bool declare,
          string *prefix)

{
  undefined8 uVar1;
  byte bVar2;
  ostream *poVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  char *pcVar4;
  string local_578;
  string local_558;
  string local_538;
  string local_518;
  string local_4f8;
  string local_4d8;
  string local_4b8;
  string local_498;
  string local_478;
  string local_458;
  string local_438;
  string local_418;
  string local_3f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3b8;
  string local_398;
  undefined1 local_371;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_370;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_350;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_330;
  string local_310;
  string local_2f0;
  string local_2d0;
  string local_2b0;
  string local_290;
  string local_270;
  string local_250;
  string local_230;
  string local_210;
  string local_1f0;
  string local_1d0;
  string local_1b0;
  string local_190;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  allocator local_59;
  string local_58 [8];
  string eq;
  t_type *ttype;
  string *prefix_local;
  bool declare_local;
  bool pointer_field_local;
  t_type *orig_type_local;
  ostream *out_local;
  t_go_generator *this_local;
  
  eq.field_2._8_8_ = t_generator::get_true_type(orig_type);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_58," = ",&local_59);
  std::allocator<char>::~allocator((allocator<char> *)&local_59);
  if (declare) {
    std::__cxx11::string::operator=(local_58," := ");
  }
  bVar2 = (**(code **)(*(long *)eq.field_2._8_8_ + 0x80))();
  if ((bVar2 & 1) == 0) {
    bVar2 = (**(code **)(*(long *)eq.field_2._8_8_ + 0x78))();
    if ((bVar2 & 1) == 0) {
      bVar2 = (**(code **)(*(long *)eq.field_2._8_8_ + 0x70))();
      if ((bVar2 & 1) == 0) {
        local_371 = 1;
        __return_storage_ptr__ =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             __cxa_allocate_exception(0x20);
        __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                (**(code **)(*(long *)eq.field_2._8_8_ + 0x18))();
        std::operator+(&local_370,"INVALID TYPE IN generate_deserialize_container \'",__rhs);
        std::operator+(&local_350,&local_370,"\' for prefix \'");
        std::operator+(&local_330,&local_350,prefix);
        std::operator+(__return_storage_ptr__,&local_330,"\'");
        local_371 = 0;
        __cxa_throw(__return_storage_ptr__,&std::__cxx11::string::typeinfo,
                    std::__cxx11::string::~string);
      }
      t_generator::indent_abi_cxx11_(&local_250,&this->super_t_generator);
      poVar3 = std::operator<<(out,(string *)&local_250);
      poVar3 = std::operator<<(poVar3,"_, size, err := iprot.ReadListBegin(ctx)");
      std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&local_250);
      t_generator::indent_abi_cxx11_(&local_270,&this->super_t_generator);
      poVar3 = std::operator<<(out,(string *)&local_270);
      poVar3 = std::operator<<(poVar3,"if err != nil {");
      std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&local_270);
      t_generator::indent_abi_cxx11_(&local_290,&this->super_t_generator);
      poVar3 = std::operator<<(out,(string *)&local_290);
      poVar3 = std::operator<<(poVar3,
                               "  return thrift.PrependError(\"error reading list begin: \", err)");
      std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&local_290);
      t_generator::indent_abi_cxx11_(&local_2b0,&this->super_t_generator);
      poVar3 = std::operator<<(out,(string *)&local_2b0);
      poVar3 = std::operator<<(poVar3,"}");
      std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&local_2b0);
      t_generator::indent_abi_cxx11_(&local_2d0,&this->super_t_generator);
      poVar3 = std::operator<<(out,(string *)&local_2d0);
      poVar3 = std::operator<<(poVar3,"tSlice := make(");
      type_to_go_type_abi_cxx11_(&local_2f0,this,orig_type);
      poVar3 = std::operator<<(poVar3,(string *)&local_2f0);
      poVar3 = std::operator<<(poVar3,", 0, size)");
      std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&local_2f0);
      std::__cxx11::string::~string((string *)&local_2d0);
      t_generator::indent_abi_cxx11_(&local_310,&this->super_t_generator);
      poVar3 = std::operator<<(out,(string *)&local_310);
      poVar3 = std::operator<<(poVar3,(string *)prefix);
      poVar3 = std::operator<<(poVar3,local_58);
      poVar3 = std::operator<<(poVar3," ");
      pcVar4 = "";
      if (pointer_field) {
        pcVar4 = "&";
      }
      poVar3 = std::operator<<(poVar3,pcVar4);
      poVar3 = std::operator<<(poVar3,"tSlice");
      std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&local_310);
    }
    else {
      t_generator::indent_abi_cxx11_(&local_170,&this->super_t_generator);
      poVar3 = std::operator<<(out,(string *)&local_170);
      poVar3 = std::operator<<(poVar3,"_, size, err := iprot.ReadSetBegin(ctx)");
      std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&local_170);
      t_generator::indent_abi_cxx11_(&local_190,&this->super_t_generator);
      poVar3 = std::operator<<(out,(string *)&local_190);
      poVar3 = std::operator<<(poVar3,"if err != nil {");
      std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&local_190);
      t_generator::indent_abi_cxx11_(&local_1b0,&this->super_t_generator);
      poVar3 = std::operator<<(out,(string *)&local_1b0);
      poVar3 = std::operator<<(poVar3,
                               "  return thrift.PrependError(\"error reading set begin: \", err)");
      std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&local_1b0);
      t_generator::indent_abi_cxx11_(&local_1d0,&this->super_t_generator);
      poVar3 = std::operator<<(out,(string *)&local_1d0);
      poVar3 = std::operator<<(poVar3,"}");
      std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&local_1d0);
      t_generator::indent_abi_cxx11_(&local_1f0,&this->super_t_generator);
      poVar3 = std::operator<<(out,(string *)&local_1f0);
      poVar3 = std::operator<<(poVar3,"tSet := make(");
      type_to_go_type_abi_cxx11_(&local_210,this,orig_type);
      poVar3 = std::operator<<(poVar3,(string *)&local_210);
      poVar3 = std::operator<<(poVar3,", 0, size)");
      std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&local_210);
      std::__cxx11::string::~string((string *)&local_1f0);
      t_generator::indent_abi_cxx11_(&local_230,&this->super_t_generator);
      poVar3 = std::operator<<(out,(string *)&local_230);
      poVar3 = std::operator<<(poVar3,(string *)prefix);
      poVar3 = std::operator<<(poVar3,local_58);
      poVar3 = std::operator<<(poVar3," ");
      pcVar4 = "";
      if (pointer_field) {
        pcVar4 = "&";
      }
      poVar3 = std::operator<<(poVar3,pcVar4);
      poVar3 = std::operator<<(poVar3,"tSet");
      std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&local_230);
    }
  }
  else {
    t_generator::indent_abi_cxx11_(&local_90,&this->super_t_generator);
    poVar3 = std::operator<<(out,(string *)&local_90);
    poVar3 = std::operator<<(poVar3,"_, _, size, err := iprot.ReadMapBegin(ctx)");
    std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_90);
    t_generator::indent_abi_cxx11_(&local_b0,&this->super_t_generator);
    poVar3 = std::operator<<(out,(string *)&local_b0);
    poVar3 = std::operator<<(poVar3,"if err != nil {");
    std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_b0);
    t_generator::indent_abi_cxx11_(&local_d0,&this->super_t_generator);
    poVar3 = std::operator<<(out,(string *)&local_d0);
    poVar3 = std::operator<<(poVar3,
                             "  return thrift.PrependError(\"error reading map begin: \", err)");
    std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_d0);
    t_generator::indent_abi_cxx11_(&local_f0,&this->super_t_generator);
    poVar3 = std::operator<<(out,(string *)&local_f0);
    poVar3 = std::operator<<(poVar3,"}");
    std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_f0);
    t_generator::indent_abi_cxx11_(&local_110,&this->super_t_generator);
    poVar3 = std::operator<<(out,(string *)&local_110);
    poVar3 = std::operator<<(poVar3,"tMap := make(");
    type_to_go_type_abi_cxx11_(&local_130,this,orig_type);
    poVar3 = std::operator<<(poVar3,(string *)&local_130);
    poVar3 = std::operator<<(poVar3,", size)");
    std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_130);
    std::__cxx11::string::~string((string *)&local_110);
    t_generator::indent_abi_cxx11_(&local_150,&this->super_t_generator);
    poVar3 = std::operator<<(out,(string *)&local_150);
    poVar3 = std::operator<<(poVar3,(string *)prefix);
    poVar3 = std::operator<<(poVar3,local_58);
    poVar3 = std::operator<<(poVar3," ");
    pcVar4 = "";
    if (pointer_field) {
      pcVar4 = "&";
    }
    poVar3 = std::operator<<(poVar3,pcVar4);
    poVar3 = std::operator<<(poVar3,"tMap");
    std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_150);
  }
  t_generator::indent_abi_cxx11_(&local_398,&this->super_t_generator);
  poVar3 = std::operator<<(out,(string *)&local_398);
  poVar3 = std::operator<<(poVar3,"for i := 0; i < size; i ++ {");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_398);
  t_generator::indent_up(&this->super_t_generator);
  if (pointer_field) {
    std::operator+(&local_3d8,"(*",prefix);
    std::operator+(&local_3b8,&local_3d8,")");
    std::__cxx11::string::operator=((string *)prefix,(string *)&local_3b8);
    std::__cxx11::string::~string((string *)&local_3b8);
    std::__cxx11::string::~string((string *)&local_3d8);
  }
  bVar2 = (**(code **)(*(long *)eq.field_2._8_8_ + 0x80))();
  uVar1 = eq.field_2._8_8_;
  if ((bVar2 & 1) == 0) {
    bVar2 = (**(code **)(*(long *)eq.field_2._8_8_ + 0x78))();
    uVar1 = eq.field_2._8_8_;
    if ((bVar2 & 1) == 0) {
      bVar2 = (**(code **)(*(long *)eq.field_2._8_8_ + 0x70))();
      uVar1 = eq.field_2._8_8_;
      if ((bVar2 & 1) != 0) {
        std::__cxx11::string::string((string *)&local_438,(string *)prefix);
        generate_deserialize_list_element(this,out,(t_list *)uVar1,declare,&local_438);
        std::__cxx11::string::~string((string *)&local_438);
      }
    }
    else {
      std::__cxx11::string::string((string *)&local_418,(string *)prefix);
      generate_deserialize_set_element(this,out,(t_set *)uVar1,declare,&local_418);
      std::__cxx11::string::~string((string *)&local_418);
    }
  }
  else {
    std::__cxx11::string::string((string *)&local_3f8,(string *)prefix);
    generate_deserialize_map_element(this,out,(t_map *)uVar1,declare,&local_3f8);
    std::__cxx11::string::~string((string *)&local_3f8);
  }
  t_generator::indent_down(&this->super_t_generator);
  t_generator::indent_abi_cxx11_(&local_458,&this->super_t_generator);
  poVar3 = std::operator<<(out,(string *)&local_458);
  poVar3 = std::operator<<(poVar3,"}");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_458);
  bVar2 = (**(code **)(*(long *)eq.field_2._8_8_ + 0x80))();
  if ((bVar2 & 1) == 0) {
    bVar2 = (**(code **)(*(long *)eq.field_2._8_8_ + 0x78))();
    if ((bVar2 & 1) == 0) {
      bVar2 = (**(code **)(*(long *)eq.field_2._8_8_ + 0x70))();
      if ((bVar2 & 1) != 0) {
        t_generator::indent_abi_cxx11_(&local_538,&this->super_t_generator);
        poVar3 = std::operator<<(out,(string *)&local_538);
        poVar3 = std::operator<<(poVar3,"if err := iprot.ReadListEnd(ctx); err != nil {");
        std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
        std::__cxx11::string::~string((string *)&local_538);
        t_generator::indent_abi_cxx11_(&local_558,&this->super_t_generator);
        poVar3 = std::operator<<(out,(string *)&local_558);
        poVar3 = std::operator<<(poVar3,
                                 "  return thrift.PrependError(\"error reading list end: \", err)");
        std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
        std::__cxx11::string::~string((string *)&local_558);
        t_generator::indent_abi_cxx11_(&local_578,&this->super_t_generator);
        poVar3 = std::operator<<(out,(string *)&local_578);
        poVar3 = std::operator<<(poVar3,"}");
        std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
        std::__cxx11::string::~string((string *)&local_578);
      }
    }
    else {
      t_generator::indent_abi_cxx11_(&local_4d8,&this->super_t_generator);
      poVar3 = std::operator<<(out,(string *)&local_4d8);
      poVar3 = std::operator<<(poVar3,"if err := iprot.ReadSetEnd(ctx); err != nil {");
      std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&local_4d8);
      t_generator::indent_abi_cxx11_(&local_4f8,&this->super_t_generator);
      poVar3 = std::operator<<(out,(string *)&local_4f8);
      poVar3 = std::operator<<(poVar3,
                               "  return thrift.PrependError(\"error reading set end: \", err)");
      std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&local_4f8);
      t_generator::indent_abi_cxx11_(&local_518,&this->super_t_generator);
      poVar3 = std::operator<<(out,(string *)&local_518);
      poVar3 = std::operator<<(poVar3,"}");
      std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&local_518);
    }
  }
  else {
    t_generator::indent_abi_cxx11_(&local_478,&this->super_t_generator);
    poVar3 = std::operator<<(out,(string *)&local_478);
    poVar3 = std::operator<<(poVar3,"if err := iprot.ReadMapEnd(ctx); err != nil {");
    std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_478);
    t_generator::indent_abi_cxx11_(&local_498,&this->super_t_generator);
    poVar3 = std::operator<<(out,(string *)&local_498);
    poVar3 = std::operator<<(poVar3,"  return thrift.PrependError(\"error reading map end: \", err)"
                            );
    std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_498);
    t_generator::indent_abi_cxx11_(&local_4b8,&this->super_t_generator);
    poVar3 = std::operator<<(out,(string *)&local_4b8);
    poVar3 = std::operator<<(poVar3,"}");
    std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_4b8);
  }
  std::__cxx11::string::~string(local_58);
  return;
}

Assistant:

void t_go_generator::generate_deserialize_container(ostream& out,
                                                    t_type* orig_type,
                                                    bool pointer_field,
                                                    bool declare,
                                                    string prefix) {
  t_type* ttype = get_true_type(orig_type);
  string eq(" = ");

  if (declare) {
    eq = " := ";
  }

  // Declare variables, read header
  if (ttype->is_map()) {
    out << indent() << "_, _, size, err := iprot.ReadMapBegin(ctx)" << endl;
    out << indent() << "if err != nil {" << endl;
    out << indent() << "  return thrift.PrependError(\"error reading map begin: \", err)" << endl;
    out << indent() << "}" << endl;
    out << indent() << "tMap := make(" << type_to_go_type(orig_type) << ", size)" << endl;
    out << indent() << prefix << eq << " " << (pointer_field ? "&" : "") << "tMap" << endl;
  } else if (ttype->is_set()) {
    out << indent() << "_, size, err := iprot.ReadSetBegin(ctx)" << endl;
    out << indent() << "if err != nil {" << endl;
    out << indent() << "  return thrift.PrependError(\"error reading set begin: \", err)" << endl;
    out << indent() << "}" << endl;
    out << indent() << "tSet := make(" << type_to_go_type(orig_type) << ", 0, size)" << endl;
    out << indent() << prefix << eq << " " << (pointer_field ? "&" : "") << "tSet" << endl;
  } else if (ttype->is_list()) {
    out << indent() << "_, size, err := iprot.ReadListBegin(ctx)" << endl;
    out << indent() << "if err != nil {" << endl;
    out << indent() << "  return thrift.PrependError(\"error reading list begin: \", err)" << endl;
    out << indent() << "}" << endl;
    out << indent() << "tSlice := make(" << type_to_go_type(orig_type) << ", 0, size)" << endl;
    out << indent() << prefix << eq << " " << (pointer_field ? "&" : "") << "tSlice" << endl;
  } else {
    throw "INVALID TYPE IN generate_deserialize_container '" + ttype->get_name() + "' for prefix '"
        + prefix + "'";
  }

  // For loop iterates over elements
  out << indent() << "for i := 0; i < size; i ++ {" << endl;
  indent_up();

  if (pointer_field) {
    prefix = "(*" + prefix + ")";
  }
  if (ttype->is_map()) {
    generate_deserialize_map_element(out, (t_map*)ttype, declare, prefix);
  } else if (ttype->is_set()) {
    generate_deserialize_set_element(out, (t_set*)ttype, declare, prefix);
  } else if (ttype->is_list()) {
    generate_deserialize_list_element(out, (t_list*)ttype, declare, prefix);
  }

  indent_down();
  out << indent() << "}" << endl;

  // Read container end
  if (ttype->is_map()) {
    out << indent() << "if err := iprot.ReadMapEnd(ctx); err != nil {" << endl;
    out << indent() << "  return thrift.PrependError(\"error reading map end: \", err)" << endl;
    out << indent() << "}" << endl;
  } else if (ttype->is_set()) {
    out << indent() << "if err := iprot.ReadSetEnd(ctx); err != nil {" << endl;
    out << indent() << "  return thrift.PrependError(\"error reading set end: \", err)" << endl;
    out << indent() << "}" << endl;
  } else if (ttype->is_list()) {
    out << indent() << "if err := iprot.ReadListEnd(ctx); err != nil {" << endl;
    out << indent() << "  return thrift.PrependError(\"error reading list end: \", err)" << endl;
    out << indent() << "}" << endl;
  }
}